

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

void Base64decode(uchar *decodedString,char *base64String)

{
  byte local_39;
  byte local_38;
  uchar local_37;
  byte local_36;
  uchar local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  uchar c3_1;
  uchar c2_2;
  uchar c1_2;
  uchar c2_1;
  uchar c1_1;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  size_t decodedIndex;
  size_t indexOfFirstEncodedChar;
  size_t numberOfEncodedChars;
  char *base64String_local;
  uchar *decodedString_local;
  
  numberOfEncodedChars = (size_t)base64String;
  base64String_local = (char *)decodedString;
  indexOfFirstEncodedChar = numberOfBase64Characters(base64String);
  decodedIndex = 0;
  _c2_2 = 0;
  for (; 3 < indexOfFirstEncodedChar; indexOfFirstEncodedChar = indexOfFirstEncodedChar - 4) {
    base64toValue(*(char *)(numberOfEncodedChars + decodedIndex),&c3_1);
    base64toValue(*(char *)(numberOfEncodedChars + 1 + decodedIndex),&local_32);
    base64toValue(*(char *)(numberOfEncodedChars + 2 + decodedIndex),&local_33);
    base64toValue(*(char *)(numberOfEncodedChars + 3 + decodedIndex),&local_34);
    base64String_local[_c2_2] = c3_1 << 2 | (byte)((int)(uint)local_32 >> 4);
    base64String_local[_c2_2 + 1] = local_32 << 4 | (byte)((int)(uint)local_33 >> 2);
    base64String_local[_c2_2 + 2] = local_33 << 6 | local_34;
    _c2_2 = _c2_2 + 3;
    decodedIndex = decodedIndex + 4;
  }
  if (indexOfFirstEncodedChar == 2) {
    base64toValue(*(char *)(numberOfEncodedChars + decodedIndex),&local_35);
    base64toValue(*(char *)(numberOfEncodedChars + 1 + decodedIndex),&local_36);
    base64String_local[_c2_2] = local_35 << 2 | (byte)((int)(uint)local_36 >> 4);
  }
  else if (indexOfFirstEncodedChar == 3) {
    base64toValue(*(char *)(numberOfEncodedChars + decodedIndex),&local_37);
    base64toValue(*(char *)(numberOfEncodedChars + 1 + decodedIndex),&local_38);
    base64toValue(*(char *)(numberOfEncodedChars + 2 + decodedIndex),&local_39);
    base64String_local[_c2_2] = local_37 << 2 | (byte)((int)(uint)local_38 >> 4);
    base64String_local[_c2_2 + 1] = local_38 << 4 | (byte)((int)(uint)local_39 >> 2);
  }
  return;
}

Assistant:

static void Base64decode(unsigned char *decodedString, const char *base64String)
{

    size_t numberOfEncodedChars;
    size_t indexOfFirstEncodedChar;
    size_t decodedIndex;

    //
    // We can only operate on individual bytes.  If we attempt to work
    // on anything larger we could get an alignment fault on some
    // architectures
    //

    numberOfEncodedChars = numberOfBase64Characters(base64String);
    indexOfFirstEncodedChar = 0;
    decodedIndex = 0;
    while (numberOfEncodedChars >= 4)
    {
        unsigned char c1;
        unsigned char c2;
        unsigned char c3;
        unsigned char c4;
        (void)base64toValue(base64String[indexOfFirstEncodedChar], &c1);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 1], &c2);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 2], &c3);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 3], &c4);
        decodedString[decodedIndex] = (c1 << 2) | (c2 >> 4);
        decodedIndex++;
        decodedString[decodedIndex] = ((c2 & 0x0f) << 4) | (c3 >> 2);
        decodedIndex++;
        decodedString[decodedIndex] = ((c3 & 0x03) << 6) | c4;
        decodedIndex++;
        numberOfEncodedChars -= 4;
        indexOfFirstEncodedChar += 4;

    }

    if (numberOfEncodedChars == 2)
    {
        unsigned char c1;
        unsigned char c2;
        (void)base64toValue(base64String[indexOfFirstEncodedChar], &c1);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 1], &c2);
        decodedString[decodedIndex] = (c1 << 2) | (c2 >> 4);
    }
    else if (numberOfEncodedChars == 3)
    {
        unsigned char c1;
        unsigned char c2;
        unsigned char c3;
        (void)base64toValue(base64String[indexOfFirstEncodedChar], &c1);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 1], &c2);
        (void)base64toValue(base64String[indexOfFirstEncodedChar + 2], &c3);
        decodedString[decodedIndex] = (c1 << 2) | (c2 >> 4);
        decodedIndex++;
        decodedString[decodedIndex] = ((c2 & 0x0f) << 4) | (c3 >> 2);
    }
}